

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void pcache1Free(void *p)

{
  int N;
  PgFreeslot *in_RDI;
  int nFreed;
  PgFreeslot *pSlot;
  
  if (in_RDI != (PgFreeslot *)0x0) {
    if ((in_RDI < pcache1_g.pStart) || (pcache1_g.pEnd <= in_RDI)) {
      N = sqlite3MallocSize((void *)0x1616d5);
      sqlite3_mutex_enter((sqlite3_mutex *)0x1616e5);
      sqlite3StatusDown(2,N);
      sqlite3_mutex_leave((sqlite3_mutex *)0x1616ff);
      sqlite3_free((void *)0x161709);
    }
    else {
      sqlite3_mutex_enter((sqlite3_mutex *)0x16165b);
      sqlite3StatusDown(1,1);
      in_RDI->pNext = pcache1_g.pFree;
      pcache1_g.nFreeSlot = pcache1_g.nFreeSlot + 1;
      pcache1_g.bUnderPressure = (int)(pcache1_g.nFreeSlot < pcache1_g.nReserve);
      pcache1_g.pFree = in_RDI;
      sqlite3_mutex_leave((sqlite3_mutex *)0x1616c1);
    }
  }
  return;
}

Assistant:

static void pcache1Free(void *p){
  if( p==0 ) return;
  if( SQLITE_WITHIN(p, pcache1.pStart, pcache1.pEnd) ){
    PgFreeslot *pSlot;
    sqlite3_mutex_enter(pcache1.mutex);
    sqlite3StatusDown(SQLITE_STATUS_PAGECACHE_USED, 1);
    pSlot = (PgFreeslot*)p;
    pSlot->pNext = pcache1.pFree;
    pcache1.pFree = pSlot;
    pcache1.nFreeSlot++;
    pcache1.bUnderPressure = pcache1.nFreeSlot<pcache1.nReserve;
    assert( pcache1.nFreeSlot<=pcache1.nSlot );
    sqlite3_mutex_leave(pcache1.mutex);
  }else{
    assert( sqlite3MemdebugHasType(p, MEMTYPE_PCACHE) );
    sqlite3MemdebugSetType(p, MEMTYPE_HEAP);
#ifndef SQLITE_DISABLE_PAGECACHE_OVERFLOW_STATS
    {
      int nFreed = 0;
      nFreed = sqlite3MallocSize(p);
      sqlite3_mutex_enter(pcache1.mutex);
      sqlite3StatusDown(SQLITE_STATUS_PAGECACHE_OVERFLOW, nFreed);
      sqlite3_mutex_leave(pcache1.mutex);
    }
#endif
    sqlite3_free(p);
  }
}